

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_bool j2k_read_tile_header
                   (opj_j2k_v2_t *p_j2k,OPJ_UINT32 *p_tile_index,OPJ_UINT32 *p_data_size,
                   OPJ_INT32 *p_tile_x0,OPJ_INT32 *p_tile_y0,OPJ_INT32 *p_tile_x1,
                   OPJ_INT32 *p_tile_y1,OPJ_UINT32 *p_nb_comps,opj_bool *p_go_on,
                   opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  byte bVar1;
  OPJ_UINT32 type;
  uint uVar2;
  opj_codestream_index_t *poVar3;
  opj_tcp_v2_t *poVar4;
  opj_tp_index_t *poVar5;
  opj_tcd_tile_v2_t *poVar6;
  OPJ_SIZE_T OVar7;
  opj_bool oVar8;
  OPJ_UINT32 OVar9;
  opj_dec_memory_marker_handler *poVar10;
  OPJ_BYTE *pOVar11;
  OPJ_OFF_T OVar12;
  ulong uVar13;
  OPJ_BYTE **ppOVar14;
  char *fmt;
  uint uVar15;
  uint uVar16;
  OPJ_UINT32 l_current_marker;
  OPJ_UINT32 l_marker_size;
  OPJ_UINT32 *local_58;
  OPJ_UINT32 *local_50;
  OPJ_INT32 *local_48;
  OPJ_INT32 *local_40;
  OPJ_INT32 *local_38;
  
  l_current_marker = 0xff90;
  OVar9 = (p_j2k->m_specific_param).m_decoder.m_state;
  local_58 = p_tile_index;
  local_50 = p_data_size;
  local_48 = p_tile_y0;
  local_40 = p_tile_x1;
  local_38 = p_tile_x0;
  if (OVar9 != 8) {
    if (OVar9 != 0x100) {
      return 0;
    }
    l_current_marker = 0xffd9;
  }
LAB_0012263c:
  bVar1 = *(byte *)((long)&p_j2k->m_specific_param + 0x54);
  if (((bVar1 & 1) == 0) && (l_current_marker != 0xffd9)) {
    while (l_current_marker != 0xff93) {
      OVar7 = opj_stream_read_data
                        (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
      if (OVar7 != 2) goto LAB_0012293c;
      opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&l_marker_size,2);
      uVar15 = (p_j2k->m_specific_param).m_decoder.m_state;
      if ((uVar15 & 0x10) != 0) {
        (p_j2k->m_specific_param).m_decoder.m_sot_length =
             ((p_j2k->m_specific_param).m_decoder.m_sot_length - l_marker_size) - 2;
      }
      uVar16 = l_marker_size - 2;
      l_marker_size = uVar16;
      poVar10 = j2k_get_marker_handler(l_current_marker);
      if ((poVar10->states & uVar15) == 0) {
        fmt = "Marker is not compliant with its position\n";
        goto LAB_0012294c;
      }
      pOVar11 = (p_j2k->m_specific_param).m_decoder.m_header_data;
      if ((p_j2k->m_specific_param).m_decoder.m_header_data_size < uVar16) {
        pOVar11 = (OPJ_BYTE *)realloc(pOVar11,(ulong)uVar16);
        (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar11;
        if (pOVar11 == (OPJ_BYTE *)0x0) {
          return 0;
        }
        (p_j2k->m_specific_param).m_decoder.m_header_data_size = l_marker_size;
        uVar16 = l_marker_size;
      }
      OVar7 = opj_stream_read_data(p_stream,pOVar11,uVar16,p_manager);
      if (OVar7 != l_marker_size) goto LAB_0012293c;
      oVar8 = (*poVar10->handler)(p_j2k,(p_j2k->m_specific_param).m_decoder.m_header_data,OVar7,
                                  p_manager);
      if (oVar8 == 0) {
        opj_event_msg_v2(p_manager,1,"Fail to read the current marker segment (%#x)\n",
                         (ulong)l_current_marker);
        return 0;
      }
      OVar9 = p_j2k->m_current_tile_number;
      poVar3 = p_j2k->cstr_index;
      type = poVar10->id;
      OVar12 = opj_stream_tell(p_stream);
      j2k_add_tlmarker_v2(OVar9,poVar3,type,(ulong)(((int)OVar12 - l_marker_size) - 4),
                          l_marker_size + 4);
      if (poVar10->id == 0xff90) {
        OVar12 = opj_stream_tell(p_stream);
        uVar13 = (ulong)(((int)OVar12 - l_marker_size) - 4);
        if ((p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos < (long)uVar13) {
          (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = uVar13;
        }
      }
      if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 4) == 0) {
        OVar7 = opj_stream_read_data
                          (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
        if (OVar7 != 2) goto LAB_0012293c;
        opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&l_current_marker,2);
      }
      else {
        uVar13 = opj_stream_skip(p_stream,(ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length,
                                 p_manager);
        if (uVar13 != (p_j2k->m_specific_param).m_decoder.m_sot_length) goto LAB_0012293c;
        l_current_marker = 0xff93;
      }
    }
    bVar1 = *(byte *)((long)&p_j2k->m_specific_param + 0x54);
    if ((bVar1 & 4) != 0) {
      *(byte *)((long)&p_j2k->m_specific_param + 0x54) = bVar1 & 0xfa;
      (p_j2k->m_specific_param).m_decoder.m_state = 8;
      goto LAB_0012290b;
    }
    uVar15 = p_j2k->m_current_tile_number;
    poVar4 = (p_j2k->m_cp).tcps;
    if ((p_j2k->m_specific_param).m_decoder.m_last_tile_part == 0) {
      OVar9 = (p_j2k->m_specific_param).m_decoder.m_sot_length;
    }
    else {
      OVar12 = opj_stream_get_number_byte_left(p_stream);
      OVar9 = (OPJ_UINT32)OVar12;
    }
    uVar16 = OVar9 - 2;
    (p_j2k->m_specific_param).m_decoder.m_sot_length = uVar16;
    if (poVar4[uVar15].m_data == (OPJ_BYTE *)0x0) {
      pOVar11 = (OPJ_BYTE *)malloc((ulong)uVar16);
    }
    else {
      pOVar11 = (OPJ_BYTE *)
                realloc(poVar4[uVar15].m_data,(ulong)(uVar16 + poVar4[uVar15].m_data_size));
    }
    poVar4[uVar15].m_data = pOVar11;
    if (pOVar11 != (OPJ_BYTE *)0x0) goto code_r0x00122871;
    fmt = "Cannot decode tile\n";
  }
  else {
    if ((l_current_marker == 0xffd9) && ((p_j2k->m_specific_param).m_decoder.m_state != 0x100)) {
      p_j2k->m_current_tile_number = 0;
      (p_j2k->m_specific_param).m_decoder.m_state = 0x100;
    }
    uVar15 = p_j2k->m_current_tile_number;
    uVar13 = (ulong)uVar15;
    if ((bVar1 & 1) == 0) {
      uVar16 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
      for (ppOVar14 = &(p_j2k->m_cp).tcps[uVar13].m_data;
          (uVar15 = (uint)uVar13, uVar15 < uVar16 && (*ppOVar14 == (OPJ_BYTE *)0x0));
          ppOVar14 = ppOVar14 + 0x2c6) {
        uVar13 = (ulong)(uVar15 + 1);
        p_j2k->m_current_tile_number = uVar15 + 1;
      }
      if (uVar16 == uVar15) {
        *p_go_on = 0;
        return 1;
      }
    }
    oVar8 = tcd_init_decode_tile(p_j2k->m_tcd,uVar15);
    if (oVar8 != 0) {
      opj_event_msg_v2(p_manager,4,"Header of tile %d / %d has been read.\n",
                       (ulong)p_j2k->m_current_tile_number,
                       (ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th - 1));
      *local_58 = p_j2k->m_current_tile_number;
      *p_go_on = 1;
      OVar9 = tcd_get_decoded_tile_size(p_j2k->m_tcd);
      *local_50 = OVar9;
      poVar6 = p_j2k->m_tcd->tcd_image->tiles;
      *local_38 = poVar6->x0;
      *local_48 = poVar6->y0;
      *local_40 = poVar6->x1;
      *p_tile_y1 = poVar6->y1;
      *p_nb_comps = poVar6->numcomps;
      *(byte *)&p_j2k->m_specific_param = *(byte *)&p_j2k->m_specific_param | 0x80;
      return 1;
    }
    fmt = "Cannot decode tile, memory error\n";
  }
  goto LAB_0012294c;
code_r0x00122871:
  poVar3 = p_j2k->cstr_index;
  if (poVar3 != (opj_codestream_index_t *)0x0) {
    OVar12 = opj_stream_tell(p_stream);
    uVar16 = p_j2k->m_current_tile_number;
    uVar2 = poVar3->tile_index[uVar16].current_tpsno;
    poVar5 = poVar3->tile_index[uVar16].tp_index;
    poVar5[uVar2].end_header = OVar12 + -2;
    poVar5[uVar2].end_pos = (ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length + OVar12;
    j2k_add_tlmarker_v2(uVar16,poVar3,0xff93,OVar12 + -2,
                        (p_j2k->m_specific_param).m_decoder.m_sot_length + 2);
    pOVar11 = poVar4[uVar15].m_data;
  }
  OVar7 = opj_stream_read_data
                    (p_stream,pOVar11 + poVar4[uVar15].m_data_size,
                     (p_j2k->m_specific_param).m_decoder.m_sot_length,p_manager);
  OVar9 = 0x40;
  if (OVar7 == (p_j2k->m_specific_param).m_decoder.m_sot_length) {
    OVar9 = 8;
  }
  (p_j2k->m_specific_param).m_decoder.m_state = OVar9;
  poVar4[uVar15].m_data_size = poVar4[uVar15].m_data_size + OVar7;
  if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0) {
LAB_0012290b:
    OVar7 = opj_stream_read_data
                      (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
    if (OVar7 != 2) {
LAB_0012293c:
      fmt = "Stream too short\n";
LAB_0012294c:
      opj_event_msg_v2(p_manager,1,fmt);
      return 0;
    }
    opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&l_current_marker,2);
  }
  goto LAB_0012263c;
}

Assistant:

opj_bool j2k_read_tile_header(	opj_j2k_v2_t * p_j2k,
					 	 	 	OPJ_UINT32 * p_tile_index,
					 	 	 	OPJ_UINT32 * p_data_size,
					 	 	 	OPJ_INT32 * p_tile_x0, OPJ_INT32 * p_tile_y0,
					 	 	 	OPJ_INT32 * p_tile_x1, OPJ_INT32 * p_tile_y1,
								OPJ_UINT32 * p_nb_comps,
								opj_bool * p_go_on,
								opj_stream_private_t *p_stream,
								opj_event_mgr_t * p_manager )
{
	OPJ_UINT32 l_current_marker = J2K_MS_SOT;
	OPJ_UINT32 l_marker_size;
	const opj_dec_memory_marker_handler_t * l_marker_handler = 00;
	opj_tcp_v2_t * l_tcp = NULL;
	OPJ_UINT32 l_nb_tiles;

	/* preconditions */
	assert(p_stream != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	/* Reach the End Of Codestream ?*/
	if (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_EOC){
		l_current_marker = J2K_MS_EOC;
	}
	/* We need to encounter a SOT marker (a new tile-part header) */
	else if	(p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT){
		return OPJ_FALSE;
	}

	/* Read into the codestream until reach the EOC or ! can_decode ??? FIXME */
	while ( (!p_j2k->m_specific_param.m_decoder.m_can_decode) && (l_current_marker != J2K_MS_EOC) ) {

		/* Try to read until the Start Of Data is detected */
		while (l_current_marker != J2K_MS_SOD) {

			/* Try to read 2 bytes (the marker size) from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read 2 bytes from the buffer as the marker size */
			opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_marker_size,2);

			/* Why this condition? FIXME */
			if (p_j2k->m_specific_param.m_decoder.m_state & J2K_STATE_TPH){
				p_j2k->m_specific_param.m_decoder.m_sot_length -= (l_marker_size + 2);
			}
			l_marker_size -= 2; /* Subtract the size of the marker ID already read */

			/* Get the marker handler from the marker ID */
			l_marker_handler = j2k_get_marker_handler(l_current_marker);

			/* Check if the marker is known and if it is the right place to find it */
			if (! (p_j2k->m_specific_param.m_decoder.m_state & l_marker_handler->states) ) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Marker is not compliant with its position\n");
				return OPJ_FALSE;
			}
/* FIXME manage case of unknown marker as in the main header ? */

			/* Check if the marker size is compatible with the header data size */
			if (l_marker_size > p_j2k->m_specific_param.m_decoder.m_header_data_size) {
				p_j2k->m_specific_param.m_decoder.m_header_data = (OPJ_BYTE*)
					opj_realloc(p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size);
				if (p_j2k->m_specific_param.m_decoder.m_header_data == 00) {
					return OPJ_FALSE;
				}
				p_j2k->m_specific_param.m_decoder.m_header_data_size = l_marker_size;
			}

			/* Try to read the rest of the marker segment from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager) != l_marker_size) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read the marker segment with the correct marker handler */
			if (! (*(l_marker_handler->handler))(p_j2k,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager)) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Fail to read the current marker segment (%#x)\n", l_current_marker);
				return OPJ_FALSE;
			}

			/* Add the marker to the codestream index*/
			j2k_add_tlmarker_v2(p_j2k->m_current_tile_number,
								p_j2k->cstr_index,
								l_marker_handler->id,
								(OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4,
								l_marker_size + 4 );

			/* Keep the position of the last SOT marker read */
			if ( l_marker_handler->id == J2K_MS_SOT ) {
				OPJ_UINT32 sot_pos = (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4 ;
				if (sot_pos > p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos)
				{
					p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos = sot_pos;
				}
			}


			if (p_j2k->m_specific_param.m_decoder.m_skip_data) {
				/* Skip the rest of the tile part header*/
				if (opj_stream_skip(p_stream,p_j2k->m_specific_param.m_decoder.m_sot_length,p_manager) != p_j2k->m_specific_param.m_decoder.m_sot_length) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}
				l_current_marker = J2K_MS_SOD; /* Normally we reached a SOD */
			}
			else {
				/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer*/
				if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}
				/* Read 2 bytes from the buffer as the new marker ID */
				opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
			}
		}

		/* If we didn't skip data before, we need to read the SOD marker*/
		if (! p_j2k->m_specific_param.m_decoder.m_skip_data) {
			/* Try to read the SOD marker and skip data ? FIXME */
			if (! j2k_read_sod_v2(p_j2k, p_stream, p_manager)) {
				return OPJ_FALSE;
			}



			if (! p_j2k->m_specific_param.m_decoder.m_can_decode){
				/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
				if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}

				/* Read 2 bytes from buffer as the new marker ID */
				opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
			}
		}
		else {
			/* Indicate we will try to read a new tile-part header*/
			p_j2k->m_specific_param.m_decoder.m_skip_data = 0;
			p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
			p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;

			/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read 2 bytes from buffer as the new marker ID */
			opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
		}
	}

	/* Current marker is the EOC marker ?*/
	if (l_current_marker == J2K_MS_EOC) {
		if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_EOC ){
			p_j2k->m_current_tile_number = 0;
			p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_EOC;
		}
	}

	/* FIXME DOC ???*/
	if ( ! p_j2k->m_specific_param.m_decoder.m_can_decode) {
		l_tcp = p_j2k->m_cp.tcps + p_j2k->m_current_tile_number;
		l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;

		while( (p_j2k->m_current_tile_number < l_nb_tiles) && (l_tcp->m_data == 00) ) {
			++p_j2k->m_current_tile_number;
			++l_tcp;
		}

		if (p_j2k->m_current_tile_number == l_nb_tiles) {
			*p_go_on = OPJ_FALSE;
			return OPJ_TRUE;
		}
	}

	/*FIXME ???*/
	if (! tcd_init_decode_tile(p_j2k->m_tcd, p_j2k->m_current_tile_number)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Cannot decode tile, memory error\n");
		return OPJ_FALSE;
	}

	opj_event_msg_v2(p_manager, EVT_INFO, "Header of tile %d / %d has been read.\n",
			p_j2k->m_current_tile_number, (p_j2k->m_cp.th * p_j2k->m_cp.tw) - 1);

	*p_tile_index = p_j2k->m_current_tile_number;
	*p_go_on = OPJ_TRUE;
	*p_data_size = tcd_get_decoded_tile_size(p_j2k->m_tcd);
	*p_tile_x0 = p_j2k->m_tcd->tcd_image->tiles->x0;
	*p_tile_y0 = p_j2k->m_tcd->tcd_image->tiles->y0;
	*p_tile_x1 = p_j2k->m_tcd->tcd_image->tiles->x1;
	*p_tile_y1 = p_j2k->m_tcd->tcd_image->tiles->y1;
	*p_nb_comps = p_j2k->m_tcd->tcd_image->tiles->numcomps;

	 p_j2k->m_specific_param.m_decoder.m_state |= 0x0080;/* FIXME J2K_DEC_STATE_DATA;*/

	return OPJ_TRUE;
}